

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O2

void __thiscall
OpenMD::SelectionSet::flip
          (SelectionSet *this,vector<int,_std::allocator<int>_> *fromIndex,
          vector<int,_std::allocator<int>_> *toIndex)

{
  long lVar1;
  int i;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    OpenMDBitSet::flip((OpenMDBitSet *)
                       ((long)&(((this->bitsets_).
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_> + lVar1),
                       (long)(fromIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar2],
                       (long)(toIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar2]);
    lVar1 = lVar1 + 0x28;
  }
  return;
}

Assistant:

void SelectionSet::flip(std::vector<int> fromIndex,
                          std::vector<int> toIndex) {
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      bitsets_[i].flip(fromIndex[i], toIndex[i]);
  }